

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_node __thiscall pugi::xml_node::child(xml_node *this,char_t *name_)

{
  xml_node_struct *p;
  bool bVar1;
  xml_node_struct *in_RAX;
  xml_node_struct **ppxVar2;
  xml_node local_18;
  
  local_18._root = in_RAX;
  if (this->_root != (xml_node_struct *)0x0) {
    ppxVar2 = &this->_root->first_child;
    while (p = *ppxVar2, p != (xml_node_struct *)0x0) {
      if ((p->name != (char_t *)0x0) &&
         (bVar1 = impl::anon_unknown_0::strequal(name_,p->name), bVar1)) {
        xml_node(&local_18,p);
        return (xml_node)local_18._root;
      }
      ppxVar2 = &p->next_sibling;
    }
  }
  xml_node(&local_18);
  return (xml_node)local_18._root;
}

Assistant:

PUGI_IMPL_FN xml_node xml_node::child(const char_t* name_) const
	{
		if (!_root) return xml_node();

		for (xml_node_struct* i = _root->first_child; i; i = i->next_sibling)
		{
			const char_t* iname = i->name;
			if (iname && impl::strequal(name_, iname))
				return xml_node(i);
		}

		return xml_node();
	}